

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O0

void __thiscall TxOrphanage::LimitOrphans(TxOrphanage *this,uint max_orphans,FastRandomContext *rng)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  strong_ordering sVar1;
  bool bVar2;
  int iVar3;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *ptVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  size_type sVar6;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_> *in_RDX;
  uint in_ESI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  long in_FS_OFFSET;
  size_t randompos;
  iterator maybeErase;
  iterator iter;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> nMinExpTime;
  int nErased;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> nNow;
  uint nEvicted;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  *in_stack_ffffffffffffff18;
  _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
  *in_stack_ffffffffffffff20;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffff30;
  LogFlags in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  _Self in_stack_ffffffffffffffb8;
  iterator in_stack_ffffffffffffffc0;
  iterator in_stack_ffffffffffffffc8;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_ffffffffffffffd0
  ;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_ffffffffffffffd8
  ;
  vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_20.
  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                          ();
  sVar1 = std::chrono::
          operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                    ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_ffffffffffffff10,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::__cmp_cat::__unspec::__unspec
            ((__unspec *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (__unspec *)0x145876a);
  bVar2 = std::operator<=(sVar1._M_value);
  if (bVar2) {
    local_20.
    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    in_stack_ffffffffffffffd0 =
         std::chrono::operator+
                   ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                    in_stack_ffffffffffffff10,
                    (duration<long,_std::ratio<60L,_1L>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffffd8 =
         std::chrono::operator-
                   ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                    in_stack_ffffffffffffff10,
                    (duration<long,_std::ratio<60L,_1L>_> *)
                    CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_stack_ffffffffffffffc8 =
         std::
         map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
         ::begin((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                  *)in_stack_ffffffffffffff10);
    while( true ) {
      in_stack_ffffffffffffffc0 =
           std::
           map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
           ::end((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                  *)in_stack_ffffffffffffff10);
      bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff18,(_Self *)in_stack_ffffffffffffff10)
      ;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      in_stack_ffffffffffffffb8 =
           std::
           _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
           ::operator++(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      sVar1 = std::chrono::
              operator<=><NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_ffffffffffffff10,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
      std::__cmp_cat::__unspec::__unspec
                ((__unspec *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (__unspec *)0x1458855);
      bVar2 = std::operator<=(sVar1._M_value);
      if (bVar2) {
        std::
        _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>::
        operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        CTransaction::GetWitnessHash
                  ((CTransaction *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        iVar3 = EraseTx((TxOrphanage *)in_stack_ffffffffffffffc0._M_node,
                        (Wtxid *)in_stack_ffffffffffffffb8._M_node);
        local_20.
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ =
             iVar3 + (int)local_20.
                          super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>::
        operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                    *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
        ptVar4 = std::
                 min<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                           ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                             *)in_stack_ffffffffffffff18,
                            (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                             *)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffffd8.__d.__r = (duration)(ptVar4->__d).__r;
      }
    }
    tVar5 = std::chrono::operator+
                      ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                       in_stack_ffffffffffffff10,
                       (duration<long,_std::ratio<60L,_1L>_> *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    in_RDI[10]._M_str = (char *)tVar5.__d.__r;
    if ((0 < (int)local_20.
                  super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) &&
       (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                    Trace), bVar2)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,(char *)in_stack_ffffffffffffff20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_RDI,(char *)in_stack_ffffffffffffff20);
      in_stack_ffffffffffffff18 = &local_20;
      in_stack_ffffffffffffff08 = 1;
      in_stack_ffffffffffffff10 = "Erased %d orphan tx due to expiration\n";
      logging_function._M_str = (char *)in_stack_ffffffffffffffd8.__d.__r;
      logging_function._M_len = (size_t)in_stack_ffffffffffffffd0.__d.__r;
      source_file._M_str = (char *)in_stack_ffffffffffffffc8._M_node;
      source_file._M_len = (size_t)in_stack_ffffffffffffffc0._M_node;
      LogPrintFormatInternal<int>
                (logging_function,source_file,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                 (Level)maybeErase._M_node,
                 (ConstevalFormatString<1U>)in_stack_ffffffffffffffb8._M_node,(int *)iter._M_node);
    }
  }
  while (sVar6 = std::
                 map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                 ::size((map<transaction_identifier<true>,_TxOrphanage::OrphanTx,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
        in_ESI < sVar6) {
    in_stack_ffffffffffffff20 = in_RDX;
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
    ::size((vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    RandomMixin<FastRandomContext>::randrange<unsigned_long>
              (in_stack_ffffffffffffff30,(unsigned_long)in_RDI);
    std::
    vector<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
    ::operator[](in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
    std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>::
    operator->((_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    CTransaction::GetWitnessHash
              ((CTransaction *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    EraseTx((TxOrphanage *)in_stack_ffffffffffffffc0._M_node,
            (Wtxid *)in_stack_ffffffffffffffb8._M_node);
    local_20.
    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         local_20.
         super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  if ((local_20.
       super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) &&
     (bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                                  Trace), bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_stack_ffffffffffffff20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,(char *)in_stack_ffffffffffffff20);
    logging_function_00._M_str = (char *)in_stack_ffffffffffffffd8.__d.__r;
    logging_function_00._M_len = (size_t)in_stack_ffffffffffffffd0.__d.__r;
    source_file_00._M_str = (char *)in_stack_ffffffffffffffc8._M_node;
    source_file_00._M_len = (size_t)in_stack_ffffffffffffffc0._M_node;
    LogPrintFormatInternal<unsigned_int>
              (logging_function_00,source_file_00,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,(Level)maybeErase._M_node,
               (ConstevalFormatString<1U>)in_stack_ffffffffffffffb8._M_node,
               &(iter._M_node)->_M_color);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TxOrphanage::LimitOrphans(unsigned int max_orphans, FastRandomContext& rng)
{
    unsigned int nEvicted = 0;
    auto nNow{Now<NodeSeconds>()};
    if (m_next_sweep <= nNow) {
        // Sweep out expired orphan pool entries:
        int nErased = 0;
        auto nMinExpTime{nNow + ORPHAN_TX_EXPIRE_TIME - ORPHAN_TX_EXPIRE_INTERVAL};
        std::map<Wtxid, OrphanTx>::iterator iter = m_orphans.begin();
        while (iter != m_orphans.end())
        {
            std::map<Wtxid, OrphanTx>::iterator maybeErase = iter++;
            if (maybeErase->second.nTimeExpire <= nNow) {
                nErased += EraseTx(maybeErase->second.tx->GetWitnessHash());
            } else {
                nMinExpTime = std::min(maybeErase->second.nTimeExpire, nMinExpTime);
            }
        }
        // Sweep again 5 minutes after the next entry that expires in order to batch the linear scan.
        m_next_sweep = nMinExpTime + ORPHAN_TX_EXPIRE_INTERVAL;
        if (nErased > 0) LogDebug(BCLog::TXPACKAGES, "Erased %d orphan tx due to expiration\n", nErased);
    }
    while (m_orphans.size() > max_orphans)
    {
        // Evict a random orphan:
        size_t randompos = rng.randrange(m_orphan_list.size());
        EraseTx(m_orphan_list[randompos]->second.tx->GetWitnessHash());
        ++nEvicted;
    }
    if (nEvicted > 0) LogDebug(BCLog::TXPACKAGES, "orphanage overflow, removed %u tx\n", nEvicted);
}